

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailureTest.cpp
# Opt level: O0

void __thiscall
TEST_TestFailure_BinaryEqualLast_TestShell::~TEST_TestFailure_BinaryEqualLast_TestShell
          (TEST_TestFailure_BinaryEqualLast_TestShell *this)

{
  TEST_TestFailure_BinaryEqualLast_TestShell *this_local;
  
  ~TEST_TestFailure_BinaryEqualLast_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(TestFailure, BinaryEqualLast)
{
    const unsigned char expectedData[] = {0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00};
	const unsigned char actualData[] = {0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01};
    BinaryEqualFailure f(test, failFileName, failLineNumber, expectedData, actualData, sizeof(expectedData), "");
    FAILURE_EQUAL("expected <00 00 00 00 00 00 00>\n"
                "\tbut was  <00 00 00 00 00 00 01>\n"
    			"\tdifference starts at position 6 at: <00 00 00 01         >\n"
    			"\t                                               ^", f);
}